

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

string * __thiscall pbrt::ConductorMaterial::ToString_abi_cxx11_(ConductorMaterial *this)

{
  string *in_RDI;
  FloatTextureHandle *in_stack_00000008;
  SpectrumTextureHandle *in_stack_00000010;
  FloatTextureHandle *in_stack_00000020;
  char *in_stack_00000028;
  FloatTextureHandle *in_stack_00000040;
  bool *in_stack_00000048;
  
  StringPrintf<pbrt::FloatTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,bool_const&>
            (in_stack_00000028,in_stack_00000020,(SpectrumTextureHandle *)this,in_stack_00000010,
             in_stack_00000008,in_stack_00000040,in_stack_00000048);
  return in_RDI;
}

Assistant:

std::string ConductorMaterial::ToString() const {
    return StringPrintf(
        "[ ConductorMaterial displacement: %s eta: %s k: %s uRoughness: %s "
        "vRoughness: %s remapRoughness: %s]",
        displacement, eta, k, uRoughness, vRoughness, remapRoughness);
}